

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::PersistentColumnData::Serialize(PersistentColumnData *this,Serializer *serializer)

{
  vector<duckdb::PersistentColumnData,_true> *this_00;
  PhysicalType PVar1;
  const_reference pvVar2;
  InternalException *this_01;
  size_type sVar3;
  size_type __n;
  allocator local_49;
  string local_48;
  
  if (this->has_updates == true) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Column data with updates cannot be serialized",&local_49);
    InternalException::InternalException(this_01,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::DataPointer,true>>
            (serializer,100,"data_pointers",&this->pointers);
  if ((this->child_columns).
      super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
      super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->child_columns).
      super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>.
      super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  this_00 = &this->child_columns;
  pvVar2 = vector<duckdb::PersistentColumnData,_true>::get<true>(this_00,0);
  Serializer::WriteProperty<duckdb::PersistentColumnData>(serializer,0x65,"validity",pvVar2);
  PVar1 = this->physical_type;
  if (PVar1 != ARRAY) {
    if (PVar1 == STRUCT) {
      sVar3 = (long)(this->child_columns).
                    super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    .
                    super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->child_columns).
                    super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    .
                    super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"sub_columns");
      (*serializer->_vptr_Serializer[8])(serializer,sVar3 - 1);
      for (__n = 1; sVar3 != __n; __n = __n + 1) {
        pvVar2 = vector<duckdb::PersistentColumnData,_true>::get<true>(this_00,__n);
        Serializer::WriteValue<duckdb::PersistentColumnData>(serializer,pvVar2);
      }
      (*serializer->_vptr_Serializer[9])(serializer);
      (*serializer->_vptr_Serializer[3])(serializer);
      return;
    }
    if (PVar1 != LIST) {
      return;
    }
  }
  pvVar2 = vector<duckdb::PersistentColumnData,_true>::get<true>(this_00,1);
  Serializer::WriteProperty<duckdb::PersistentColumnData>(serializer,0x66,"child_column",pvVar2);
  return;
}

Assistant:

void PersistentColumnData::Serialize(Serializer &serializer) const {
	if (has_updates) {
		throw InternalException("Column data with updates cannot be serialized");
	}
	serializer.WritePropertyWithDefault(100, "data_pointers", pointers);
	if (child_columns.empty()) {
		// validity column
		D_ASSERT(physical_type == PhysicalType::BIT);
		return;
	}
	serializer.WriteProperty(101, "validity", child_columns[0]);
	if (physical_type == PhysicalType::ARRAY || physical_type == PhysicalType::LIST) {
		D_ASSERT(child_columns.size() == 2);
		serializer.WriteProperty(102, "child_column", child_columns[1]);
	} else if (physical_type == PhysicalType::STRUCT) {
		serializer.WriteList(102, "sub_columns", child_columns.size() - 1,
		                     [&](Serializer::List &list, idx_t i) { list.WriteElement(child_columns[i + 1]); });
	}
}